

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

void __thiscall
Catch::JsonValueWriter::writeImpl<unsigned_long,void>
          (JsonValueWriter *this,unsigned_long *value,bool quote_value)

{
  StringRef local_38 [2];
  
  std::ostream::_M_insert<unsigned_long>((ulong)&this->field_0x18);
  std::__cxx11::stringbuf::str();
  writeImpl(this,local_38[0],quote_value);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void writeImpl( T const& value, bool quote_value ) {
            m_sstream << value;
            writeImpl( m_sstream.str(), quote_value );
        }